

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::GetShortPath(string *path,string *shortPath)

{
  std::__cxx11::string::_M_assign((string *)shortPath);
  return true;
}

Assistant:

bool SystemTools::GetShortPath(const kwsys_stl::string& path, kwsys_stl::string& shortPath)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const int size = int(path.size()) +1; // size of return
  char *tempPath = new char[size];  // create a buffer
  DWORD ret;

  // if the path passed in has quotes around it, first remove the quotes
  if (!path.empty() && path[0] == '"' && *path.rbegin() == '"')
    {
    strcpy(tempPath,path.c_str()+1);
    tempPath[size-2] = '\0';
    }
  else
    {
    strcpy(tempPath,path.c_str());
    }

  kwsys_stl::wstring wtempPath = Encoding::ToWide(tempPath);
  kwsys_stl::vector<wchar_t> buffer(wtempPath.size()+1);
  buffer[0] = 0;
  ret = GetShortPathNameW(wtempPath.c_str(),
    &buffer[0], static_cast<DWORD>(wtempPath.size()));

  if(buffer[0] == 0 || ret > wtempPath.size())
    {
    delete [] tempPath;
    return false;
    }
  else
    {
    shortPath = Encoding::ToNarrow(&buffer[0]);
    delete [] tempPath;
    return true;
    }
#else
  shortPath = path;
  return true;
#endif
}